

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseReference
          (AsciiParser *this,Reference *out,bool *triple_deliminated)

{
  bool bVar1;
  ostream *poVar2;
  char nc;
  allocator local_201;
  AssetPath ap;
  string local_1c0;
  ostringstream ss_e;
  
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if ((bVar1) && (bVar1 = LookChar1(this,&nc), bVar1)) {
    if (nc == '<') {
      ::std::__cxx11::string::string((string *)&ap,"",(allocator *)&local_1c0);
      tinyusdz::value::AssetPath::AssetPath((AssetPath *)&ss_e,&ap.asset_path_);
      tinyusdz::value::AssetPath::operator=(&out->asset_path,(AssetPath *)&ss_e);
      tinyusdz::value::AssetPath::~AssetPath((AssetPath *)&ss_e);
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      ap.asset_path_._M_dataplus._M_p = (pointer)&ap.asset_path_.field_2;
      ap.asset_path_._M_string_length = 0;
      ap.asset_path_.field_2._M_local_buf[0] = '\0';
      ap.resolved_path_._M_dataplus._M_p = (pointer)&ap.resolved_path_.field_2;
      ap.resolved_path_._M_string_length = 0;
      ap.resolved_path_.field_2._M_local_buf[0] = '\0';
      bVar1 = ParseAssetIdentifier(this,&ap,triple_deliminated);
      if (bVar1) {
        tinyusdz::value::AssetPath::operator=(&out->asset_path,&ap);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[ASCII]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseReference");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x9e9);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)&ss_e,"Failed to parse asset path identifier.");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::stringbuf::str();
        PushError(this,&local_1c0);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      }
      tinyusdz::value::AssetPath::~AssetPath(&ap);
      if (!bVar1) {
        return false;
      }
    }
    bVar1 = SkipWhitespace(this);
    if ((bVar1) && (bVar1 = Char1(this,&nc), bVar1)) {
      bVar1 = Rewind(this,1);
      if (nc == '<') {
        if (bVar1) {
          ap.asset_path_._M_dataplus._M_p = (pointer)&ap.asset_path_.field_2;
          ap.asset_path_._M_string_length = 0;
          ap.asset_path_.field_2._M_local_buf[0] = '\0';
          bVar1 = ReadPathIdentifier(this,&ap.asset_path_);
          if (bVar1) {
            ::std::__cxx11::string::string((string *)&local_1c0,"",&local_201);
            Path::Path((Path *)&ss_e,&ap.asset_path_,&local_1c0);
            Path::operator=(&out->prim_path,(Path *)&ss_e);
            Path::~Path((Path *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            return true;
          }
          ::std::__cxx11::string::_M_dispose();
        }
      }
      else if (bVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseReference(Reference *out, bool *triple_deliminated) {
  /*
    Asset reference = AsssetIdentifier + optially followd by prim path

    AssetIdentifier could be empty(self-reference?)

    Example:
     "bora"
     @bora@
     @bora@</dora>
     </bora>
  */

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  // Parse AssetIdentifier
  {
    char nc;
    if (!LookChar1(&nc)) {
      return false;
    }

    if (nc == '<') {
      // No Asset Identifier.
      out->asset_path = value::AssetPath("");
    } else {
      value::AssetPath ap;
      if (!ParseAssetIdentifier(&ap, triple_deliminated)) {
        PUSH_ERROR_AND_RETURN_TAG(kAscii,
                                  "Failed to parse asset path identifier.");
      }
      out->asset_path = ap;
    }
  }

  // Parse optional prim_path
  if (!SkipWhitespace()) {
    return false;
  }

  {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '<') {
      if (!Rewind(1)) {
        return false;
      }

      std::string path;
      if (!ReadPathIdentifier(&path)) {
        return false;
      }

      out->prim_path = Path(path, "");
    } else {
      if (!Rewind(1)) {
        return false;
      }
    }
  }

  // TODO: LayerOffset and CustomData

  return true;
}